

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d64_q1b_moving_median.cpp
# Opt level: O0

int main(void)

{
  size_t __n;
  istream *this;
  reference pvVar1;
  reference piVar2;
  ostream *poVar3;
  iterator __position;
  ulong local_e0;
  size_t i_4;
  iterator tmp;
  size_t i_3;
  size_t i_2;
  iterator it;
  ulong local_90;
  size_t i_1;
  multiset<int,_std::less<int>,_std::allocator<int>_> s;
  size_t i;
  allocator<int> local_39;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> v;
  size_t w;
  size_t n;
  
  n._4_4_ = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&w);
  std::istream::operator>>
            (this,(ulong *)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  __n = w;
  std::allocator<int>::allocator(&local_39);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,__n,&local_39);
  std::allocator<int>::~allocator(&local_39);
  for (s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      s._M_t._M_impl.super__Rb_tree_header._M_node_count < w;
      s._M_t._M_impl.super__Rb_tree_header._M_node_count =
           s._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,
                        s._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::istream::operator>>((istream *)&std::cin,pvVar1);
  }
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::multiset
            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
  for (local_90 = 0;
      local_90 <
      (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage + 1U; local_90 = local_90 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,local_90);
    it = std::multiset<int,_std::less<int>,_std::allocator<int>_>::insert
                   ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&i_1,pvVar1);
  }
  i_2 = (size_t)std::multiset<int,_std::less<int>,_std::allocator<int>_>::begin
                          ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
  for (i_3 = 0; i_3 < (ulong)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage >> 1; i_3 = i_3 + 1) {
    std::_Rb_tree_const_iterator<int>::operator++((_Rb_tree_const_iterator<int> *)&i_2);
  }
  for (tmp._M_node = (_Base_ptr)0x0;
      tmp._M_node <
      (_Base_ptr)
      (w - (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage); tmp._M_node = (_Base_ptr)((long)&(tmp._M_node)->_M_color + 1))
  {
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)&i_2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar3," ");
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(size_type)tmp._M_node);
    __position = std::multiset<int,_std::less<int>,_std::allocator<int>_>::find
                           ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&i_1,pvVar1);
    std::multiset<int,std::less<int>,std::allocator<int>>::erase_abi_cxx11_
              ((multiset<int,std::less<int>,std::allocator<int>> *)&i_1,
               (const_iterator)__position._M_node);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,
                        (size_type)
                        ((byte *)((long)&(tmp._M_node)->_M_color + 1) +
                        (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage));
    std::multiset<int,_std::less<int>,_std::allocator<int>_>::insert
              ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&i_1,pvVar1);
    i_2 = (size_t)std::multiset<int,_std::less<int>,_std::allocator<int>_>::begin
                            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
    for (local_e0 = 0;
        local_e0 <
        (ulong)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage >> 1; local_e0 = local_e0 + 1) {
      std::_Rb_tree_const_iterator<int>::operator++((_Rb_tree_const_iterator<int> *)&i_2);
    }
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::~multiset
            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return n._4_4_;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    size_t n,w;
    cin >> n >> w;
    vector<int> v(n);
    for (size_t i = 0; i < n; ++i) {
        cin >> v[i];
    }
    multiset<int> s;
    for (size_t i = 0; i < w+1; ++i) {
        s.insert(v[i]);
    }
    auto it = s.begin();
    for (size_t i = 0; i < w/2; ++i) {
        ++it;
    }
    for (size_t i = 0; i < n-w; ++i) {
        cout << *it << " ";
        auto tmp = s.find(v[i]);
        s.erase(tmp);
        s.insert(v[i+w+1]);
        it = s.begin();
        for (size_t i = 0; i < w/2; ++i) {
            ++it;
        }
    }
    cout << endl;
}